

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

void LexHexadecimal(SQChar *s,SQUnsignedInteger *res)

{
  char cVar1;
  int iVar2;
  SQUnsignedInteger SVar3;
  char *pcVar4;
  int iVar5;
  
  *res = 0;
  cVar1 = *s;
  if (cVar1 != '\0') {
    pcVar4 = s + 1;
    SVar3 = 0;
    do {
      iVar5 = (int)cVar1;
      if (iVar5 - 0x30U < 10) {
        SVar3 = SVar3 << 4 | (ulong)(iVar5 - 0x30U);
      }
      else {
        iVar2 = isxdigit(iVar5);
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqlexer.cpp"
                        ,0x1c3,"void LexHexadecimal(const SQChar *, SQUnsignedInteger *)");
        }
        iVar5 = toupper(iVar5);
        SVar3 = (SVar3 * 0x10 + (long)iVar5) - 0x37;
      }
      *res = SVar3;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
  }
  return;
}

Assistant:

void LexHexadecimal(const SQChar *s,SQUnsignedInteger *res)
{
    *res = 0;
    while(*s != 0)
    {
        if(scisdigit(*s)) *res = (*res)*16+((*s++)-'0');
        else if(scisxdigit(*s)) *res = (*res)*16+(toupper(*s++)-'A'+10);
        else { assert(0); }
    }
}